

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O2

void __thiscall
rengine::OpenGLRenderer::drawTextureQuad
          (OpenGLRenderer *this,uint offset,GLuint texId,float opacity,Format format)

{
  ProgramUpdate bit;
  Program *shader;
  
  if ((opacity != 1.0) || (NAN(opacity))) {
    activateShader(this,&(this->prog_alphaTexture).super_Program);
    ensureMatrixUpdated(this,UpdateAlphaTextureProgram,&(this->prog_alphaTexture).super_Program);
    glUniform1f(opacity,(this->prog_alphaTexture).alpha);
  }
  else {
    if ((format == BGRA_32) || (format == BGRx_32)) {
      shader = &this->prog_texture_bgr;
      activateShader(this,shader);
      bit = UpdateTextureBgrProgram;
    }
    else {
      shader = &this->prog_texture;
      activateShader(this,shader);
      bit = UpdateTextureProgram;
    }
    ensureMatrixUpdated(this,bit,shader);
  }
  glVertexAttribPointer(0,2,0x1406,0,0,(ulong)offset << 3);
  glBindTexture(0xde1,texId);
  glDrawArrays(5,0,4);
  return;
}

Assistant:

inline void OpenGLRenderer::drawTextureQuad(unsigned offset, GLuint texId, float opacity, Texture::Format format)
{
    if (opacity == 1) {
        if (format == Texture::BGRA_32 || format == Texture::BGRx_32) {
            activateShader(&prog_texture_bgr);
            ensureMatrixUpdated(UpdateTextureBgrProgram, &prog_texture_bgr);
        } else {
            activateShader(&prog_texture);
            ensureMatrixUpdated(UpdateTextureProgram, &prog_texture);
        }
    } else {
        activateShader(&prog_alphaTexture);
        ensureMatrixUpdated(UpdateAlphaTextureProgram, &prog_alphaTexture);
        glUniform1f(prog_alphaTexture.alpha, opacity);
    }

    glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, (void *) (offset * sizeof(vec2)));
    glBindTexture(GL_TEXTURE_2D, texId);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
}